

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_video.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 *in_RSI;
  int in_EDI;
  double dVar10;
  double incr;
  int filename_arg_idx;
  _Bool use_frame_events;
  _Bool redraw;
  _Bool fullscreen;
  ALLEGRO_VIDEO *video;
  ALLEGRO_TIMER *timer;
  ALLEGRO_EVENT event;
  ALLEGRO_EVENT_QUEUE *queue;
  double local_80;
  int local_78;
  byte local_71;
  int local_60 [8];
  undefined4 local_40;
  ALLEGRO_VIDEO *in_stack_ffffffffffffffe0;
  
  local_71 = 0;
  bVar1 = true;
  bVar2 = false;
  local_78 = 1;
  uVar5 = al_install_system(0x5020700,atexit);
  if ((uVar5 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  if (1 < in_EDI) {
    if ((in_EDI == 3) && (iVar4 = strcmp((char *)in_RSI[1],"--use-frame-events"), iVar4 == 0)) {
      bVar2 = true;
      local_78 = 2;
    }
    uVar5 = al_init_video_addon();
    if ((uVar5 & 1) == 0) {
      abort_example("Could not initialize the video addon.\n");
    }
    al_init_font_addon();
    al_install_keyboard();
    al_install_audio();
    al_reserve_samples(1);
    al_init_primitives_addon();
    uVar6 = al_create_timer(0x3f91111111111111);
    al_set_new_display_flags(0x10);
    al_set_new_display_option(0x1a,1,2);
    screen = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
    if (screen == (ALLEGRO_DISPLAY *)0x0) {
      abort_example("Could not set video mode - exiting\n");
    }
    font = (ALLEGRO_FONT *)al_create_builtin_font();
    if (font == (ALLEGRO_FONT *)0x0) {
      abort_example("No font.\n");
    }
    al_set_new_bitmap_flags(0xc0);
    filename = (char *)in_RSI[local_78];
    lVar7 = al_open_video(filename);
    if (lVar7 == 0) {
      abort_example("Cannot read %s.\n",filename);
    }
    al_get_video_fps(lVar7);
    log_printf("video FPS: %f\n");
    al_get_video_audio_rate(lVar7);
    log_printf("video audio rate: %f\n");
    log_printf(
              "keys:\nSpace: Play/Pause\ncursor right/left: seek 10 seconds\ncursor up/down: seek one minute\nF: toggle fullscreen\n1: disable scaling\nS: scale to window\n"
              );
    uVar8 = al_create_event_queue();
    uVar9 = al_get_video_event_source(lVar7);
    al_register_event_source(uVar8,uVar9);
    uVar9 = al_get_display_event_source(screen);
    al_register_event_source(uVar8,uVar9);
    uVar9 = al_get_timer_event_source(uVar6);
    al_register_event_source(uVar8,uVar9);
    uVar9 = al_get_keyboard_event_source();
    al_register_event_source(uVar8,uVar9);
    uVar9 = al_get_default_mixer();
    al_start_video(lVar7,uVar9);
    al_start_timer(uVar6);
LAB_00102904:
    do {
      while( true ) {
        if ((bVar1) && (uVar5 = al_is_event_queue_empty(uVar8), (uVar5 & 1) != 0)) {
          video_display(in_stack_ffffffffffffffe0);
          bVar1 = false;
        }
        al_wait_for_event(uVar8,local_60);
        if (local_60[0] == 10) break;
        if (local_60[0] == 0x1e) {
          if (!bVar2) {
            bVar1 = true;
          }
        }
        else if (local_60[0] == 0x29) {
          al_acknowledge_resize(screen);
          uVar6 = al_map_rgb(0,0);
          al_clear_to_color(uVar6);
        }
        else {
          if (local_60[0] == 0x2a) {
            al_close_video(lVar7);
            goto LAB_00102b2d;
          }
          if (local_60[0] == 0x226) {
            if (bVar2) {
              bVar1 = true;
            }
          }
          else if (local_60[0] == 0x227) {
            log_printf("video finished\n");
          }
        }
      }
      switch(local_40) {
      case 6:
        local_71 = (local_71 ^ 0xff) & 1;
        al_set_display_flag(screen,0x200,local_71);
        goto LAB_00102904;
      default:
        goto LAB_00102904;
      case 0x13:
        zoom = 0.0;
        goto LAB_00102904;
      case 0x1c:
        zoom = 1.0;
        goto LAB_00102904;
      case 0x3b:
        goto switchD_001029cd_caseD_3b;
      case 0x4b:
        bVar3 = al_is_video_playing(lVar7);
        al_set_video_playing(lVar7,(bVar3 ^ 0xff) & 1);
        goto LAB_00102904;
      case 0x52:
        local_80 = -10.0;
        break;
      case 0x53:
        local_80 = 10.0;
        break;
      case 0x54:
        local_80 = 60.0;
        break;
      case 0x55:
        local_80 = -60.0;
      }
      dVar10 = (double)al_get_video_position(lVar7,0);
      al_seek_video(dVar10 + local_80,lVar7);
    } while( true );
  }
  log_printf("This example needs to be run from the command line.\nUsage: %s [--use-frame-events] <file>\n"
             ,*in_RSI);
LAB_00102b2d:
  al_destroy_display(screen);
  close_log(true);
  return 0;
switchD_001029cd_caseD_3b:
  al_close_video(lVar7);
  goto LAB_00102b2d;
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   ALLEGRO_TIMER *timer;
   ALLEGRO_VIDEO *video;
   bool fullscreen = false;
   bool redraw = true;
   bool use_frame_events = false;
   int filename_arg_idx = 1;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc < 2) {
      log_printf("This example needs to be run from the command line.\n"
                 "Usage: %s [--use-frame-events] <file>\n", argv[0]);
      goto done;
   }

   /* If use_frame_events is false, we use a fixed FPS timer. If the video is
    * displayed in a game this probably makes most sense. In a
    * dedicated video player you probably want to listen to
    * ALLEGRO_EVENT_VIDEO_FRAME_SHOW events and only redraw whenever one
    * arrives - to reduce possible jitter and save CPU.
    */
   if (argc == 3 && strcmp(argv[1], "--use-frame-events") == 0) {
      use_frame_events = true;
      filename_arg_idx++;
   }

   if (!al_init_video_addon()) {
      abort_example("Could not initialize the video addon.\n");
   }
   al_init_font_addon();
   al_install_keyboard();

   al_install_audio();
   al_reserve_samples(1);
   al_init_primitives_addon();

   timer = al_create_timer(1.0 / 60);

   al_set_new_display_flags(ALLEGRO_RESIZABLE);
   al_set_new_display_option(ALLEGRO_VSYNC, 1, ALLEGRO_SUGGEST);
   screen = al_create_display(640, 480);
   if (!screen) {
      abort_example("Could not set video mode - exiting\n");
   }
   
   font = al_create_builtin_font();
   if (!font) {
      abort_example("No font.\n");
   }

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);

   filename = argv[filename_arg_idx];
   video = al_open_video(filename);
   if (!video) {
      abort_example("Cannot read %s.\n", filename);
   }
   log_printf("video FPS: %f\n", al_get_video_fps(video));
   log_printf("video audio rate: %f\n", al_get_video_audio_rate(video));
   log_printf(
      "keys:\n"
      "Space: Play/Pause\n"
      "cursor right/left: seek 10 seconds\n"
      "cursor up/down: seek one minute\n"
      "F: toggle fullscreen\n"
      "1: disable scaling\n"
      "S: scale to window\n");

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_video_event_source(video));
   al_register_event_source(queue, al_get_display_event_source(screen));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_register_event_source(queue, al_get_keyboard_event_source());

   al_start_video(video, al_get_default_mixer());
   al_start_timer(timer);
   for (;;) {
      double incr;

      if (redraw && al_event_queue_is_empty(queue)) {
         video_display(video);
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_SPACE:
                  al_set_video_playing(video, !al_is_video_playing(video));
                  break;
               case ALLEGRO_KEY_ESCAPE:
                  al_close_video(video);
                  goto done;
                  break;
               case ALLEGRO_KEY_LEFT:
                  incr = -10.0;
                  goto do_seek;
               case ALLEGRO_KEY_RIGHT:
                  incr = 10.0;
                  goto do_seek;
               case ALLEGRO_KEY_UP:
                  incr = 60.0;
                  goto do_seek;
               case ALLEGRO_KEY_DOWN:
                  incr = -60.0;
                  goto do_seek;

               do_seek:
                  al_seek_video(video, al_get_video_position(video, ALLEGRO_VIDEO_POSITION_ACTUAL) + incr);
                  break;

               case ALLEGRO_KEY_F:
                  fullscreen = !fullscreen;
                  al_set_display_flag(screen, ALLEGRO_FULLSCREEN_WINDOW,
                     fullscreen);
                  break;
               
               case ALLEGRO_KEY_1:
                  zoom = 1;
                  break;

               case ALLEGRO_KEY_S:
                  zoom = 0;
                  break;
               default:
                  break;
            }
            break;
         
         case ALLEGRO_EVENT_DISPLAY_RESIZE:
            al_acknowledge_resize(screen);
            al_clear_to_color(al_map_rgb(0, 0, 0));
            break;

         case ALLEGRO_EVENT_TIMER:
            /*
            display_time += 1.0 / 60;
            if (display_time >= video_time) {
               video_time = display_time + video_refresh_timer(is);
            }*/

            if (!use_frame_events) {
               redraw = true;
            }
            break;

         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            al_close_video(video);
            goto done;
            break;

         case ALLEGRO_EVENT_VIDEO_FRAME_SHOW:
            if (use_frame_events) {
               redraw = true;
            }
            break;

         case ALLEGRO_EVENT_VIDEO_FINISHED:
            log_printf("video finished\n");
            break;
         default:
            break;
      }
   }
done:
   al_destroy_display(screen);
   close_log(true);
   return 0;
}